

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
mpt::typed_array<mpt::reference<mpt::metatype>_*>::typed_array
          (typed_array<mpt::reference<mpt::metatype>_*> *this,long len)

{
  int iVar1;
  undefined4 extraout_var;
  content<mpt::reference<mpt::metatype>_*> *pcVar2;
  default_data *pdVar3;
  
  (this->super_unique_array<mpt::reference<mpt::metatype>_*>)._ref._ref =
       (content<mpt::reference<mpt::metatype>_*> *)0x0;
  if (typed_array<mpt::reference<mpt::metatype>*>::typed_array(long)::_dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&typed_array<mpt::reference<mpt::metatype>*>::typed_array(long)::
                                 _dummy);
    if (iVar1 != 0) {
      default_data::default_data(&typed_array::_dummy);
      __cxa_guard_release(&typed_array<mpt::reference<mpt::metatype>*>::typed_array(long)::_dummy);
    }
  }
  if (len < 0) {
    pdVar3 = &typed_array::_dummy;
  }
  else {
    iVar1 = (*typed_array::_dummy.super_default_data.super_content<mpt::reference<mpt::metatype>_*>.
              super_buffer._vptr_buffer[3])(&typed_array::_dummy,len << 3);
    pdVar3 = (default_data *)CONCAT44(extraout_var,iVar1);
  }
  pcVar2 = (this->super_unique_array<mpt::reference<mpt::metatype>_*>)._ref._ref;
  if (pcVar2 != (content<mpt::reference<mpt::metatype>_*> *)0x0) {
    (*(pcVar2->super_buffer)._vptr_buffer[1])();
  }
  pcVar2 = (content<mpt::reference<mpt::metatype>_*> *)&typed_array::_dummy;
  if ((content<mpt::reference<mpt::metatype>_*> *)pdVar3 !=
      (content<mpt::reference<mpt::metatype>_*> *)0x0) {
    pcVar2 = (content<mpt::reference<mpt::metatype>_*> *)pdVar3;
  }
  (this->super_unique_array<mpt::reference<mpt::metatype>_*>)._ref._ref = pcVar2;
  return;
}

Assistant:

typed_array(long len = -1) : unique_array<T>(static_cast<content<T> *>(0))
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		this->_ref.set_instance(data ? data : &_dummy);
	}